

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall OutputStatement::Action(OutputStatement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  compile_errcode cVar3;
  undefined4 uVar4;
  SymbolType expression_type;
  string str;
  SymbolType local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cVar3 = 0;
  uVar4 = 0;
LAB_001305f5:
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar4) {
    case 0:
      uVar4 = 1;
      if (SVar1 != PRINTF_SYM) goto LAB_001306c4;
      break;
    case 1:
      uVar4 = 2;
      if (SVar1 != L_CIRCLE_BRACKET_SYM) goto LAB_001306c4;
      break;
    case 2:
      if (SVar1 != STRING_SYM) goto switchD_00130615_caseD_4;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"This is a string","");
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      uVar4 = 3;
      break;
    case 3:
      uVar4 = 4;
      if (SVar1 != COMMA_SYM) {
        if (SVar1 != R_CIRCLE_BRACKET_SYM) goto LAB_001306c4;
        uVar4 = 6;
      }
      break;
    case 4:
      goto switchD_00130615_caseD_4;
    case 5:
      uVar4 = 6;
      if (SVar1 != R_CIRCLE_BRACKET_SYM) goto LAB_001306c4;
      break;
    case 6:
      goto switchD_00130615_caseD_6;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
switchD_00130615_caseD_4:
  cVar2 = Expression::Action(&this->m_expression,&local_54);
  uVar4 = 5;
  if (cVar2 != 0) {
LAB_001306c4:
    cVar3 = -1;
switchD_00130615_caseD_6:
    return cVar3;
  }
  goto LAB_001305f5;
}

Assistant:

compile_errcode OutputStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == PRINTF_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == STRING_SYM) {
                    string str("This is a string");
                    state = 3;
                    break;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == COMMA_SYM) {
                    state = 4;
                    break;
                } else if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 6: return COMPILE_OK;
        }
        if (state != 5)
            handle_correct_queue->NextSymbol();
    }
}